

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O1

string * sutil::trim(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  long lVar2;
  char cVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + s->_M_string_length);
  std::__cxx11::string::replace
            ((ulong)__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length - 1,'\n');
  cVar3 = (char)__return_storage_ptr__;
  std::__cxx11::string::find_first_not_of(cVar3,0x20);
  std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
  lVar2 = std::__cxx11::string::find_last_not_of(cVar3,0x20);
  std::__cxx11::string::erase((ulong)__return_storage_ptr__,lVar2 + 1);
  std::__cxx11::string::find_first_not_of(cVar3,9);
  std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
  lVar2 = std::__cxx11::string::find_last_not_of(cVar3,9);
  std::__cxx11::string::erase((ulong)__return_storage_ptr__,lVar2 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string sutil::trim(const std::string &s) {
    std::string str = s;
    str.replace(0, str.size() - 1, '\n', ' ');
    str.erase(0, str.find_first_not_of(' '));
    str.erase(str.find_last_not_of(' ') + 1, str.size());
    str.erase(0, str.find_first_not_of('\t'));
    str.erase(str.find_last_not_of('\t') + 1, str.size());
    return str;
}